

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_test.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  string timestampSeparator;
  string logFileName;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"file_test.log",(allocator<char> *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48," ## ",&local_49);
  juzzlin::FileTest::initializeLoggger(&local_28,&local_48);
  juzzlin::FileTest::testAllLoggingLevels_allMessagesShouldBeFoundInFile(&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return 0;
}

Assistant:

int main(int, char **)
{
    const std::string logFileName = "file_test.log";
    const std::string timestampSeparator = " ## ";

    juzzlin::FileTest::initializeLoggger(logFileName, timestampSeparator);

    juzzlin::FileTest::testAllLoggingLevels_allMessagesShouldBeFoundInFile(logFileName, timestampSeparator);

    return EXIT_SUCCESS;
}